

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info_test_helper.cc
# Opt level: O1

ProtoStreamObjectSource * __thiscall
google::protobuf::util::converter::testing::TypeInfoTestHelper::NewProtoSource
          (TypeInfoTestHelper *this,CodedInputStream *coded_input,string *type_url)

{
  long *plVar1;
  pointer pcVar2;
  size_t size;
  Type *type;
  LogMessage *other;
  ProtoStreamObjectSource *this_00;
  LogMessage local_70;
  LogFinisher local_31;
  
  plVar1 = *(long **)(this + 8);
  pcVar2 = (type_url->_M_dataplus)._M_p;
  size = type_url->_M_string_length;
  if ((long)size < 0) {
    StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
  }
  type = (Type *)(**(code **)(*plVar1 + 0x18))(plVar1,pcVar2,size);
  if (*(int *)this == 0) {
    this_00 = (ProtoStreamObjectSource *)operator_new(0x40);
    ProtoStreamObjectSource::ProtoStreamObjectSource
              (this_00,coded_input,*(TypeResolver **)(this + 0x10),type);
  }
  else {
    protobuf::internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/internal/type_info_test_helper.cc"
               ,0x61);
    other = protobuf::internal::LogMessage::operator<<(&local_70,"Can not reach here.");
    protobuf::internal::LogFinisher::operator=(&local_31,other);
    protobuf::internal::LogMessage::~LogMessage(&local_70);
    this_00 = (ProtoStreamObjectSource *)0x0;
  }
  return this_00;
}

Assistant:

ProtoStreamObjectSource* TypeInfoTestHelper::NewProtoSource(
    io::CodedInputStream* coded_input, const std::string& type_url) {
  const google::protobuf::Type* type = typeinfo_->GetTypeByTypeUrl(type_url);
  switch (type_) {
    case USE_TYPE_RESOLVER: {
      return new ProtoStreamObjectSource(coded_input, type_resolver_.get(),
                                         *type);
    }
  }
  GOOGLE_LOG(FATAL) << "Can not reach here.";
  return NULL;
}